

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

int Pdr_ManGeneralize(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,Pdr_Set_t **ppCubeMin)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  Pdr_Set_t *pCube_00;
  int *piVar7;
  Pdr_Set_t *pPVar8;
  long lVar9;
  long lVar10;
  
  aVar5 = Abc_Clock();
  *ppCubeMin = (Pdr_Set_t *)0x0;
  iVar2 = Pdr_ManCheckCube(p,k,pCube,ppPred,p->pPars->nConfLimit);
  if (iVar2 != -1) {
    if (iVar2 == 0) {
      aVar6 = Abc_Clock();
      p->tGeneral = p->tGeneral + (aVar6 - aVar5);
      iVar2 = 0;
    }
    else {
      pCube_00 = Pdr_ManReduceClause(p,k,pCube);
      if (pCube_00 == (Pdr_Set_t *)0x0) {
        pCube_00 = Pdr_SetDup(pCube);
      }
      if (p->pPars->fSkipGeneral == 0) {
        piVar7 = Pdr_ManSortByPriority(p,pCube_00);
        for (iVar2 = 0; iVar4 = pCube_00->nLits, iVar2 < iVar4; iVar2 = iVar2 + 1) {
          lVar9 = (long)iVar2;
          iVar4 = piVar7[lVar9];
          lVar10 = (long)iVar4;
          if (*(int *)(&pCube_00->field_0x14 + lVar10 * 4) == -1) {
            __assert_fail("pCubeMin->Lits[i] != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                          ,0x154,
                          "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                         );
          }
          iVar3 = Pdr_SetIsInit(pCube_00,iVar4);
          if (iVar3 == 0) {
            uVar1 = *(undefined4 *)(&pCube_00->field_0x14 + lVar10 * 4);
            *(undefined4 *)(&pCube_00->field_0x14 + lVar10 * 4) = 0xffffffff;
            iVar3 = Pdr_ManCheckCube(p,k,pCube_00,(Pdr_Set_t **)0x0,p->pPars->nConfLimit);
            if (iVar3 == -1) goto LAB_00475b63;
            *(undefined4 *)(&pCube_00->field_0x14 + lVar10 * 4) = uVar1;
            if (iVar3 != 0) {
              for (; lVar9 < (long)pCube_00->nLits + -1; lVar9 = lVar9 + 1) {
                piVar7[lVar9] = piVar7[lVar9 + 1];
              }
              pPVar8 = Pdr_SetCreateFrom(pCube_00,iVar4);
              Pdr_SetDeref(pCube_00);
              if (pPVar8->nLits < 1) {
                __assert_fail("pCubeMin->nLits > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                              ,0x16b,
                              "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                             );
              }
              iVar2 = iVar2 + -1;
              piVar7 = Pdr_ManSortByPriority(p,pPVar8);
              pCube_00 = pPVar8;
            }
          }
        }
        if (p->pPars->fTwoRounds != 0) {
          for (iVar2 = 0; iVar2 < iVar4; iVar2 = iVar2 + 1) {
            lVar9 = (long)iVar2;
            iVar4 = piVar7[lVar9];
            lVar10 = (long)iVar4;
            if (*(int *)(&pCube_00->field_0x14 + lVar10 * 4) == -1) {
              __assert_fail("pCubeMin->Lits[i] != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                            ,0x17a,
                            "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                           );
            }
            iVar3 = Pdr_SetIsInit(pCube_00,iVar4);
            pPVar8 = pCube_00;
            if (iVar3 == 0) {
              uVar1 = *(undefined4 *)(&pCube_00->field_0x14 + lVar10 * 4);
              *(undefined4 *)(&pCube_00->field_0x14 + lVar10 * 4) = 0xffffffff;
              iVar3 = Pdr_ManCheckCube(p,k,pCube_00,(Pdr_Set_t **)0x0,p->pPars->nConfLimit);
              if (iVar3 == -1) {
LAB_00475b63:
                Pdr_SetDeref(pCube_00);
                return -1;
              }
              *(undefined4 *)(&pCube_00->field_0x14 + lVar10 * 4) = uVar1;
              if (iVar3 != 0) {
                for (; lVar9 < (long)pCube_00->nLits + -1; lVar9 = lVar9 + 1) {
                  piVar7[lVar9] = piVar7[lVar9 + 1];
                }
                pPVar8 = Pdr_SetCreateFrom(pCube_00,iVar4);
                Pdr_SetDeref(pCube_00);
                if (pPVar8->nLits < 1) {
                  __assert_fail("pCubeMin->nLits > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                                ,0x191,
                                "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                               );
                }
                iVar2 = iVar2 + -1;
                piVar7 = Pdr_ManSortByPriority(p,pPVar8);
              }
            }
            iVar4 = pPVar8->nLits;
            pCube_00 = pPVar8;
          }
        }
      }
      *ppCubeMin = pCube_00;
      aVar6 = Abc_Clock();
      p->tGeneral = p->tGeneral + (aVar6 - aVar5);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int Pdr_ManGeneralize( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, Pdr_Set_t ** ppCubeMin )
{
    Pdr_Set_t * pCubeMin, * pCubeTmp = NULL;
    int i, j, n, Lit, RetValue;
    abctime clk = Abc_Clock();
    int * pOrder;
    // if there is no induction, return
    *ppCubeMin = NULL;
    RetValue = Pdr_ManCheckCube( p, k, pCube, ppPred, p->pPars->nConfLimit );
    if ( RetValue == -1 )
        return -1;
    if ( RetValue == 0 )
    {
        p->tGeneral += Abc_Clock() - clk;
        return 0;
    }

    // reduce clause using assumptions
//    pCubeMin = Pdr_SetDup( pCube );
    pCubeMin = Pdr_ManReduceClause( p, k, pCube );
    if ( pCubeMin == NULL )
        pCubeMin = Pdr_SetDup( pCube );

    // perform generalization
    if ( !p->pPars->fSkipGeneral )
    {
        // sort literals by their occurences
        pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        // try removing literals
        for ( j = 0; j < pCubeMin->nLits; j++ )
        {
            // use ordering
    //        i = j;
            i = pOrder[j];

            // check init state
            assert( pCubeMin->Lits[i] != -1 );
            if ( Pdr_SetIsInit(pCubeMin, i) )
                continue;
            // try removing this literal
            Lit = pCubeMin->Lits[i]; pCubeMin->Lits[i] = -1;
            RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, p->pPars->nConfLimit );
            if ( RetValue == -1 )
            {
                Pdr_SetDeref( pCubeMin );
                return -1;
            }
            pCubeMin->Lits[i] = Lit;
            if ( RetValue == 0 )
                continue;

            // remove j-th entry
            for ( n = j; n < pCubeMin->nLits-1; n++ )
                pOrder[n] = pOrder[n+1];
            j--;

            // success - update the cube
            pCubeMin = Pdr_SetCreateFrom( pCubeTmp = pCubeMin, i );
            Pdr_SetDeref( pCubeTmp );
            assert( pCubeMin->nLits > 0 );
            i--;

            // get the ordering by decreasing priorit
            pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        }

        if ( p->pPars->fTwoRounds )
        for ( j = 0; j < pCubeMin->nLits; j++ )
        {
            // use ordering
    //        i = j;
            i = pOrder[j];

            // check init state
            assert( pCubeMin->Lits[i] != -1 );
            if ( Pdr_SetIsInit(pCubeMin, i) )
                continue;
            // try removing this literal
            Lit = pCubeMin->Lits[i]; pCubeMin->Lits[i] = -1;
            RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, p->pPars->nConfLimit );
            if ( RetValue == -1 )
            {
                Pdr_SetDeref( pCubeMin );
                return -1;
            }
            pCubeMin->Lits[i] = Lit;
            if ( RetValue == 0 )
                continue;

            // remove j-th entry
            for ( n = j; n < pCubeMin->nLits-1; n++ )
                pOrder[n] = pOrder[n+1];
            j--;

            // success - update the cube
            pCubeMin = Pdr_SetCreateFrom( pCubeTmp = pCubeMin, i );
            Pdr_SetDeref( pCubeTmp );
            assert( pCubeMin->nLits > 0 );
            i--;

            // get the ordering by decreasing priorit
            pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        }
    }

    assert( ppCubeMin != NULL );
    *ppCubeMin = pCubeMin;
    p->tGeneral += Abc_Clock() - clk;
    return 1;
}